

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorPool::DescriptorPool
          (DescriptorPool *this,DescriptorDatabase *fallback_database,
          ErrorCollector *error_collector)

{
  Mutex *this_00;
  Tables *this_01;
  ErrorCollector *error_collector_local;
  DescriptorDatabase *fallback_database_local;
  DescriptorPool *this_local;
  
  absl::lts_20250127::Mutex::Mutex(&this->field_memo_table_mutex_);
  std::
  make_unique<absl::lts_20250127::flat_hash_map<std::pair<void_const*,void_const*>,std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,std::default_delete<google::protobuf::DescriptorPool::MemoBase>>,absl::lts_20250127::hash_internal::Hash<std::pair<void_const*,void_const*>>,std::equal_to<std::pair<void_const*,void_const*>>,std::allocator<std::pair<std::pair<void_const*,void_const*>const,std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,std::default_delete<google::protobuf::DescriptorPool::MemoBase>>>>>>
            ();
  this_00 = (Mutex *)operator_new(8);
  absl::lts_20250127::Mutex::Mutex(this_00);
  this->mutex_ = this_00;
  this->fallback_database_ = fallback_database;
  this->default_error_collector_ = error_collector;
  this->underlay_ = (DescriptorPool *)0x0;
  std::
  unique_ptr<absl::lts_20250127::AnyInvocable<void(absl::lts_20250127::FunctionRef<void()>)const>,std::default_delete<absl::lts_20250127::AnyInvocable<void(absl::lts_20250127::FunctionRef<void()>)const>>>
  ::
  unique_ptr<std::default_delete<absl::lts_20250127::AnyInvocable<void(absl::lts_20250127::FunctionRef<void()>)const>>,void>
            ((unique_ptr<absl::lts_20250127::AnyInvocable<void(absl::lts_20250127::FunctionRef<void()>)const>,std::default_delete<absl::lts_20250127::AnyInvocable<void(absl::lts_20250127::FunctionRef<void()>)const>>>
              *)&this->dispatcher_);
  this_01 = (Tables *)operator_new(0x1a0);
  Tables::Tables(this_01);
  std::
  unique_ptr<google::protobuf::DescriptorPool::Tables,std::default_delete<google::protobuf::DescriptorPool::Tables>>
  ::unique_ptr<std::default_delete<google::protobuf::DescriptorPool::Tables>,void>
            ((unique_ptr<google::protobuf::DescriptorPool::Tables,std::default_delete<google::protobuf::DescriptorPool::Tables>>
              *)&this->tables_,this_01);
  this->enforce_dependencies_ = true;
  this->lazily_build_dependencies_ = false;
  this->allow_unknown_ = false;
  this->enforce_weak_ = false;
  this->enforce_extension_declarations_ = kNoEnforcement;
  this->disallow_enforce_utf8_ = false;
  this->deprecated_legacy_json_field_conflicts_ = false;
  this->enforce_naming_style_ = false;
  this->build_started_ = false;
  absl::lts_20250127::
  flat_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::flat_hash_map(&this->direct_input_files_);
  std::
  unique_ptr<google::protobuf::FeatureSetDefaults,std::default_delete<google::protobuf::FeatureSetDefaults>>
  ::unique_ptr<std::default_delete<google::protobuf::FeatureSetDefaults>,void>
            ((unique_ptr<google::protobuf::FeatureSetDefaults,std::default_delete<google::protobuf::FeatureSetDefaults>>
              *)&this->feature_set_defaults_spec_);
  return;
}

Assistant:

DescriptorPool::DescriptorPool(DescriptorDatabase* fallback_database,
                               ErrorCollector* error_collector)
    : mutex_(new absl::Mutex),
      fallback_database_(fallback_database),
      default_error_collector_(error_collector),
      underlay_(nullptr),
      tables_(new Tables),
      enforce_dependencies_(true),
      lazily_build_dependencies_(false),
      allow_unknown_(false),
      enforce_weak_(false),
      enforce_extension_declarations_(ExtDeclEnforcementLevel::kNoEnforcement),
      disallow_enforce_utf8_(false),
      deprecated_legacy_json_field_conflicts_(false),
      enforce_naming_style_(false) {}